

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O1

void * lj_ccallback_new(CTState *cts,CType *ct,GCfunc *fn)

{
  ushort uVar1;
  CType *pCVar2;
  CType *pCVar3;
  global_State *pgVar4;
  GCtab *t;
  uint64_t uVar5;
  bool bVar6;
  undefined8 *start;
  CTypeID1 *p;
  TValue *pTVar7;
  void *pvVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  uint uVar11;
  CType *pCVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  GCobj *o;
  ulong uVar16;
  
  if (((ct->info & 0xf0000000) == 0x20000000) && (ct->size == 8)) {
    pCVar2 = cts->tab;
    pCVar3 = pCVar2 + (ushort)ct->info;
    uVar11 = pCVar3->info;
    if ((uVar11 & 0xf0000000) != 0x60000000) goto LAB_001435bb;
    uVar15 = pCVar2[(ushort)pCVar3->info].info;
    uVar1 = pCVar3->sib;
    uVar14 = uVar15 >> 0x1c;
    if ((uVar14 < 6) && ((0x34U >> uVar14 & 1) != 0)) {
      if ((uVar11 >> 0x17 & 1) != 0) goto LAB_001435bb;
LAB_00143507:
      iVar13 = 0;
      for (; pCVar12 = pCVar3, uVar1 != 0; uVar1 = pCVar2[(uint)uVar1].sib) {
        uVar11 = pCVar2[(ushort)pCVar2[(uint)uVar1].info].info;
        uVar15 = uVar11 >> 0x1c;
        if (((uVar15 == 2) || (uVar15 == 5)) ||
           ((uVar11 < 0x10000000 && (pCVar2[(ushort)pCVar2[(uint)uVar1].info].size < 9)))) {
          bVar6 = iVar13 < 0x10;
          iVar13 = iVar13 + 1;
        }
        else {
          bVar6 = false;
        }
        pCVar12 = (CType *)0x0;
        if (!bVar6) break;
      }
    }
    else {
      if (0xfffffff < uVar15) goto LAB_001435bb;
      pCVar12 = (CType *)0x0;
      if (((uVar11 >> 0x17 & 1) == 0) && (pCVar2[(ushort)pCVar3->info].size < 9)) goto LAB_00143507;
    }
  }
  else {
LAB_001435bb:
    pCVar12 = (CType *)0x0;
  }
  if (pCVar12 == (CType *)0x0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pCVar3 = cts->tab;
    p = (cts->cb).cbid;
    uVar11 = (cts->cb).topid;
    uVar16 = (ulong)uVar11;
    uVar15 = (cts->cb).sizeid;
    if (uVar11 < uVar15) {
      do {
        if (p[uVar16] == 0) goto LAB_00143730;
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
      uVar16 = (ulong)uVar15;
    }
    if (0x37f < (uint)uVar16) {
LAB_001437e4:
      lj_err_caller(cts->L,LJ_ERR_FFI_CBACKOV);
    }
    if ((cts->cb).mcode == (void *)0x0) {
      uVar11 = 0;
      start = (undefined8 *)mmap64((void *)0x0,0x1000,3,0x22,-1,0);
      if (start == (undefined8 *)0xffffffffffffffff) goto LAB_001437e4;
      (cts->cb).mcode = start;
      pgVar4 = cts->g;
      *start = lj_vm_ffi_callback;
      puVar9 = start + 1;
      do {
        *(undefined1 *)puVar9 = 0xb0;
        *(char *)((long)puVar9 + 1) = (char)uVar11;
        if ((uVar11 & 0x1f) == 0x1f) {
          *(undefined2 *)((long)puVar9 + 2) = 0xb455;
          *(char *)((long)puVar9 + 4) = (char)(uVar11 >> 8);
          *(undefined2 *)((long)puVar9 + 5) = 0xbd48;
          *(global_State **)((long)puVar9 + 7) = pgVar4;
          *(undefined2 *)((long)puVar9 + 0xf) = 0x25ff;
          puVar10 = (undefined8 *)((long)puVar9 + 0x15);
          *(int *)((long)puVar9 + 0x11) = (int)start - (int)puVar10;
        }
        else {
          *(undefined1 *)((long)puVar9 + 2) = 0xeb;
          *(byte *)((long)puVar9 + 3) = ((char)(uVar11 & 0x1f) << 2 ^ 0x7cU) - 2;
          puVar10 = (undefined8 *)((long)puVar9 + 4);
        }
        uVar11 = uVar11 + 1;
        puVar9 = puVar10;
      } while (uVar11 != 0x380);
      lj_mcode_sync(start,start + 0x200);
      mprotect(start,0x1000,5);
    }
    p = (CTypeID1 *)lj_mem_grow(cts->L,p,&(cts->cb).sizeid,0x380,2);
    (cts->cb).cbid = p;
    memset(p + uVar16,0,(ulong)((cts->cb).sizeid - (uint)uVar16) * 2);
LAB_00143730:
    uVar11 = (uint)uVar16;
    p[uVar16 & 0xffffffff] = (short)((uint)((int)pCVar12 - (int)pCVar3) >> 3) * -0x5555;
    (cts->cb).topid = uVar11 + 1;
    t = cts->miscmap;
    if (uVar11 < t->asize) {
      pTVar7 = (TValue *)((long)(int)uVar11 * 8 + (t->array).ptr64);
    }
    else {
      pTVar7 = lj_tab_setinth(cts->L,t,uVar11);
    }
    pTVar7->u64 = (ulong)fn | 0xfffb800000000000;
    if ((t->marked & 4) != 0) {
      uVar5 = (cts->L->glref).ptr64;
      t->marked = t->marked & 0xfb;
      (t->gclist).gcptr64 = *(uint64_t *)(uVar5 + 0x40);
      *(GCtab **)(uVar5 + 0x40) = t;
    }
    pvVar8 = (void *)((ulong)(((uint)(uVar16 >> 5) & 0x7ffffff) * 0x11 + uVar11 * 4 + 8) +
                     (long)(cts->cb).mcode);
  }
  return pvVar8;
}

Assistant:

void *lj_ccallback_new(CTState *cts, CType *ct, GCfunc *fn)
{
  ct = callback_checkfunc(cts, ct);
  if (ct) {
    MSize slot = callback_slot_new(cts, ct);
    GCtab *t = cts->miscmap;
    setfuncV(cts->L, lj_tab_setint(cts->L, t, (int32_t)slot), fn);
    lj_gc_anybarriert(cts->L, t);
    return callback_slot2ptr(cts, slot);
  }
  return NULL;  /* Bad conversion. */
}